

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEnc_Encode
               (CLzmaEncHandle pp,ISeqOutStream *outStream,ISeqInStream *inStream,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  SRes SVar1;
  SRes SVar2;
  CLzmaEnc *p;
  
  *(ISeqInStream **)((long)pp + 0x3d358) = inStream;
  *(ISeqOutStream **)((long)pp + 0x3d318) = outStream;
  SVar1 = LzmaEnc_AllocAndInit((CLzmaEnc *)pp,0,alloc,allocBig);
  if (SVar1 == 0) {
    SVar1 = 10;
    do {
      SVar2 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,0,0,0);
      if (SVar2 != 0) {
        return SVar2;
      }
      if (*(int *)((long)pp + 0x3d344) != 0) {
        return 0;
      }
    } while ((progress == (ICompressProgress *)0x0) ||
            (SVar2 = (*progress->Progress)
                               (progress,*(UInt64 *)((long)pp + 0x3d338),
                                ((*(long *)((long)pp + 0x3d320) + *(long *)((long)pp + 0x3d300)) -
                                *(long *)((long)pp + 0x3d310)) + *(long *)((long)pp + 0x3d2f8)),
            SVar2 == 0));
  }
  return SVar1;
}

Assistant:

SRes LzmaEnc_Encode(CLzmaEncHandle pp, ISeqOutStream* outStream, ISeqInStream* inStream, ICompressProgress* progress,
                    ISzAlloc* alloc, ISzAlloc* allocBig) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  SRes res = SZ_OK;

#ifdef COMPRESS_MF_MT
  Byte allocaDummy[0x300];
  (void)allocaDummy;
  int i = 0;
  for (i = 0; i < 16; i++)
    allocaDummy[i] = (Byte)i;
#endif

  RINOK(LzmaEnc_Prepare(pp, inStream, outStream, alloc, allocBig));

  for (;;) {
    res = LzmaEnc_CodeOneBlock(p, False, 0, 0);
    if (res != SZ_OK || p->finished != 0)
      break;
    if (progress != 0) {
      res = progress->Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK) {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  LzmaEnc_Finish(pp);
  return res;
}